

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  pointer *this_00;
  pointer *this_01;
  initializer_list<cmListFileArgument> __l;
  bool bVar1;
  bool bVar2;
  string *psVar3;
  char *filename;
  cmMessenger *messenger;
  element_type *peVar4;
  size_type sVar5;
  reference pcVar6;
  cmake *this_02;
  pointer defer;
  reference ppcVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  cmListFileArgument *local_970;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_730;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_728;
  iterator sdi;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_6f8;
  const_iterator local_6f0;
  allocator<cmListFileArgument> local_6e3;
  undefined1 local_6e2;
  allocator<char> local_6e1;
  string local_6e0;
  allocator<char> local_6b9;
  string local_6b8;
  cmListFileArgument *local_698;
  cmListFileArgument local_690;
  cmListFileArgument local_660;
  iterator local_630;
  size_type local_628;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_620;
  allocator<char> local_601;
  string local_600;
  undefined1 local_5e0 [8];
  cmListFileFunction project;
  string local_5c8;
  basic_string_view<char,_std::char_traits<char>_> local_5a8;
  basic_string_view<char,_std::char_traits<char>_> local_598;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_588;
  reference local_578;
  cmListFileFunction *func_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range2_1;
  bool hasProject;
  cmListFileFunction *func_1;
  iterator __end4;
  iterator __begin4;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range4;
  allocator<char> local_519;
  value_type local_518;
  _Base_ptr local_4f8;
  undefined1 local_4f0;
  allocator<char> local_4e1;
  value_type local_4e0;
  _Base_ptr local_4c0;
  undefined1 local_4b8;
  allocator<char> local_4a9;
  value_type local_4a8;
  _Base_ptr local_488;
  undefined1 local_480;
  allocator<char> local_471;
  value_type local_470;
  _Base_ptr local_450;
  undefined1 local_448;
  allocator<char> local_439;
  value_type local_438;
  _Base_ptr local_418;
  undefined1 local_410;
  allocator<char> local_401;
  value_type local_400;
  _Base_ptr local_3e0;
  undefined1 local_3d8;
  allocator<char> local_3c9;
  value_type local_3c8;
  _Base_ptr local_3a8;
  undefined1 local_3a0;
  allocator<char> local_391;
  value_type local_390;
  _Base_ptr local_370;
  undefined1 local_368;
  allocator<char> local_359;
  value_type local_358;
  _Base_ptr local_338;
  undefined1 local_330;
  allocator<char> local_321;
  value_type local_320;
  _Base_ptr local_300;
  undefined1 local_2f8;
  allocator<char> local_2e9;
  value_type local_2e8;
  undefined1 local_2c8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowedCommands;
  bool isProblem;
  cmListFileFunction *func;
  iterator __end2;
  iterator __begin2;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range2;
  undefined1 local_238 [7];
  bool hasVersion;
  undefined1 local_228 [16];
  undefined1 local_218 [24];
  undefined1 local_200 [16];
  undefined1 local_1f0 [24];
  cmListFile listFile;
  undefined1 local_1b8 [39];
  allocator<char> local_191;
  string local_190;
  undefined1 local_170 [48];
  undefined1 local_140 [8];
  string filesDir;
  BuildsystemFileScope scope;
  cmListFileContext local_d8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_68;
  cmStateDirectory local_58;
  undefined1 local_30 [8];
  string currentStart;
  cmMakefile *this_local;
  
  currentStart.field_2._8_8_ = this;
  cmStateSnapshot::GetDirectory(&local_58,&this->StateSnapshot);
  psVar3 = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_58);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[16]>
            ((string *)local_30,psVar3,(char (*) [16])"/CMakeLists.txt");
  cmListFileContext::FromListFilePath(&local_d8,(string *)local_30);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            (&local_68,(cmListFileContext *)&this->Backtrace);
  cmListFileBacktrace::operator=(&this->Backtrace,(cmListFileBacktrace *)&local_68);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_68);
  cmListFileContext::~cmListFileContext(&local_d8);
  BuildsystemFileScope::BuildsystemFileScope
            ((BuildsystemFileScope *)((long)&filesDir.field_2 + 8),this);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)(local_170 + 8),&this->StateSnapshot);
  psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)(local_170 + 8));
  cmStrCat<std::__cxx11::string_const&,char_const(&)[12]>
            ((string *)local_140,psVar3,(char (*) [12])"/CMakeFiles");
  local_170._0_8_ = cmsys::SystemTools::MakeDirectory((string *)local_140,(mode_t *)0x0);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_30,true);
  if (!bVar1) {
    __assert_fail("cmSystemTools::FileExists(currentStart, true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx"
                  ,0x6d6,"void cmMakefile::Configure()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"CMAKE_PARENT_LIST_FILE",&local_191);
  local_1b8._16_16_ = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  AddDefinition(this,&local_190,(string_view)local_1b8._16_16_);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  GetCMakeInstance(this);
  cmake::GetDebugAdapter((cmake *)local_1b8);
  bVar1 = std::operator!=((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_1b8,(nullptr_t)0x0);
  std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
            ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_1b8);
  if (bVar1) {
    GetCMakeInstance(this);
    this_00 = &listFile.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    cmake::GetDebugAdapter((cmake *)this_00);
    peVar4 = std::
             __shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_00);
    cmDebugger::cmDebuggerAdapter::OnBeginFileParse(peVar4,this,(string *)local_30);
    std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)
               &listFile.Functions.
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  cmListFile::cmListFile((cmListFile *)(local_1f0 + 0x10));
  filename = (char *)std::__cxx11::string::c_str();
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseFile
                    ((cmListFile *)(local_1f0 + 0x10),filename,messenger,&this->Backtrace);
  if (bVar1) {
    GetCMakeInstance(this);
    cmake::GetDebugAdapter((cmake *)local_218);
    bVar1 = std::operator!=((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_218,(nullptr_t)0x0);
    std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_218);
    if (bVar1) {
      GetCMakeInstance(this);
      cmake::GetDebugAdapter((cmake *)local_228);
      peVar4 = std::
               __shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_228);
      cmDebugger::cmDebuggerAdapter::OnEndFileParse(peVar4);
      std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
                ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_228);
      GetCMakeInstance(this);
      cmake::GetDebugAdapter((cmake *)local_238);
      peVar4 = std::
               __shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_238);
      cmDebugger::cmDebuggerAdapter::OnFileParsedSuccessfully
                (peVar4,(string *)local_30,
                 (vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                 (local_1f0 + 0x10));
      std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
                ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_238);
    }
    bVar1 = IsRootMakefile(this);
    if (bVar1) {
      bVar1 = false;
      __end2 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                         ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                          (local_1f0 + 0x10));
      func = (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                       ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                        (local_1f0 + 0x10));
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                    *)&func);
        if (!bVar2) break;
        pcVar6 = __gnu_cxx::
                 __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                 ::operator*(&__end2);
        psVar3 = cmListFileFunction::LowerCaseName_abi_cxx11_(pcVar6);
        _Var9 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
        bVar10 = (basic_string_view<char,_std::char_traits<char>_>)
                 ::cm::operator____s("cmake_minimum_required",0x16);
        bVar2 = std::operator==(_Var9,bVar10);
        if (bVar2) {
          bVar1 = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
        ::operator++(&__end2);
      }
      if (!bVar1) {
        allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        sVar5 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                          ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                           (local_1f0 + 0x10));
        if (sVar5 < 0x1e) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2c8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2e8,"project",&local_2e9);
          pVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2c8,&local_2e8);
          local_300 = (_Base_ptr)pVar8.first._M_node;
          local_2f8 = pVar8.second;
          std::__cxx11::string::~string((string *)&local_2e8);
          std::allocator<char>::~allocator(&local_2e9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"set",&local_321);
          pVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2c8,&local_320);
          local_338 = (_Base_ptr)pVar8.first._M_node;
          local_330 = pVar8.second;
          std::__cxx11::string::~string((string *)&local_320);
          std::allocator<char>::~allocator(&local_321);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"if",&local_359);
          pVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2c8,&local_358);
          local_370 = (_Base_ptr)pVar8.first._M_node;
          local_368 = pVar8.second;
          std::__cxx11::string::~string((string *)&local_358);
          std::allocator<char>::~allocator(&local_359);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_390,"endif",&local_391);
          pVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2c8,&local_390);
          local_3a8 = (_Base_ptr)pVar8.first._M_node;
          local_3a0 = pVar8.second;
          std::__cxx11::string::~string((string *)&local_390);
          std::allocator<char>::~allocator(&local_391);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"else",&local_3c9)
          ;
          pVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2c8,&local_3c8);
          local_3e0 = (_Base_ptr)pVar8.first._M_node;
          local_3d8 = pVar8.second;
          std::__cxx11::string::~string((string *)&local_3c8);
          std::allocator<char>::~allocator(&local_3c9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_400,"elseif",&local_401);
          pVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2c8,&local_400);
          local_418 = (_Base_ptr)pVar8.first._M_node;
          local_410 = pVar8.second;
          std::__cxx11::string::~string((string *)&local_400);
          std::allocator<char>::~allocator(&local_401);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_438,"add_executable",&local_439);
          pVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2c8,&local_438);
          local_450 = (_Base_ptr)pVar8.first._M_node;
          local_448 = pVar8.second;
          std::__cxx11::string::~string((string *)&local_438);
          std::allocator<char>::~allocator(&local_439);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_470,"add_library",&local_471);
          pVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2c8,&local_470);
          local_488 = (_Base_ptr)pVar8.first._M_node;
          local_480 = pVar8.second;
          std::__cxx11::string::~string((string *)&local_470);
          std::allocator<char>::~allocator(&local_471);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4a8,"target_link_libraries",&local_4a9);
          pVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2c8,&local_4a8);
          local_4c0 = (_Base_ptr)pVar8.first._M_node;
          local_4b8 = pVar8.second;
          std::__cxx11::string::~string((string *)&local_4a8);
          std::allocator<char>::~allocator(&local_4a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4e0,"option",&local_4e1);
          pVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2c8,&local_4e0);
          local_4f8 = (_Base_ptr)pVar8.first._M_node;
          local_4f0 = pVar8.second;
          std::__cxx11::string::~string((string *)&local_4e0);
          std::allocator<char>::~allocator(&local_4e1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_518,"message",&local_519);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2c8,&local_518);
          std::__cxx11::string::~string((string *)&local_518);
          std::allocator<char>::~allocator(&local_519);
          allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
          __end4 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                             ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                              (local_1f0 + 0x10));
          func_1 = (cmListFileFunction *)
                   std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                             ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                              (local_1f0 + 0x10));
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              (&__end4,(__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                        *)&func_1);
            if (!bVar1) break;
            pcVar6 = __gnu_cxx::
                     __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                     ::operator*(&__end4);
            psVar3 = cmListFileFunction::LowerCaseName_abi_cxx11_(pcVar6);
            bVar1 = ::cm::
                    contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_2c8,psVar3);
            if (!bVar1) {
              allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
              break;
            }
            __gnu_cxx::
            __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
            ::operator++(&__end4);
          }
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2c8);
        }
        if ((allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
          SetCheckCMP0000(this,true);
          cmPolicies::ApplyPolicyVersion(this,2,4,0,Off);
        }
      }
      bVar1 = false;
      __end2_1 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                           ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                            (local_1f0 + 0x10));
      func_2 = (cmListFileFunction *)
               std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                         ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                          (local_1f0 + 0x10));
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end2_1,
                           (__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                            *)&func_2);
        if (!bVar2) break;
        local_578 = __gnu_cxx::
                    __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                    ::operator*(&__end2_1);
        psVar3 = cmListFileFunction::LowerCaseName_abi_cxx11_(local_578);
        _Var9 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
        local_588 = _Var9;
        bVar10 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("project",7);
        local_5a8 = bVar10;
        local_598 = bVar10;
        bVar2 = std::operator==(local_588,bVar10);
        if (bVar2) {
          bVar1 = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
        ::operator++(&__end2_1);
      }
      if (!bVar1) {
        this_02 = GetCMakeInstance(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5c8,
                   "No project() command is present.  The top-level CMakeLists.txt file must contain a literal, direct call to the project() command.  Add a line of code such as\n  project(ProjectName)\nnear the top of the file, but after cmake_minimum_required().\nCMake is pretending there is a \"project(Project)\" command on the first line."
                   ,(allocator<char> *)
                    ((long)&project.Impl.
                            super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 7));
        cmake::IssueMessage(this_02,AUTHOR_WARNING,&local_5c8,&this->Backtrace);
        std::__cxx11::string::~string((string *)&local_5c8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&project.Impl.
                           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + 7));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_600,"project",&local_601);
        local_6e2 = 1;
        local_698 = &local_690;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6b8,"Project",&local_6b9);
        cmListFileArgument::cmListFileArgument(&local_690,&local_6b8,Unquoted,0);
        local_698 = &local_660;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6e0,"__CMAKE_INJECTED_PROJECT_COMMAND__",&local_6e1);
        cmListFileArgument::cmListFileArgument(&local_660,&local_6e0,Unquoted,0);
        local_6e2 = 0;
        local_630 = &local_690;
        local_628 = 2;
        std::allocator<cmListFileArgument>::allocator(&local_6e3);
        __l._M_len = local_628;
        __l._M_array = local_630;
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
                  (&local_620,__l,&local_6e3);
        cmListFileFunction::cmListFileFunction
                  ((cmListFileFunction *)local_5e0,&local_600,0,0,&local_620);
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_620);
        std::allocator<cmListFileArgument>::~allocator(&local_6e3);
        local_970 = (cmListFileArgument *)&local_630;
        do {
          local_970 = local_970 + -1;
          cmListFileArgument::~cmListFileArgument(local_970);
        } while (local_970 != &local_690);
        std::__cxx11::string::~string((string *)&local_6e0);
        std::allocator<char>::~allocator(&local_6e1);
        std::__cxx11::string::~string((string *)&local_6b8);
        std::allocator<char>::~allocator(&local_6b9);
        std::__cxx11::string::~string((string *)&local_600);
        std::allocator<char>::~allocator(&local_601);
        local_6f8._M_current =
             (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                       ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                        (local_1f0 + 0x10));
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_const*,std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>>
        ::__normal_iterator<cmListFileFunction*>
                  ((__normal_iterator<cmListFileFunction_const*,std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>>
                    *)&local_6f0,&local_6f8);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
                  ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                   (local_1f0 + 0x10),local_6f0,(value_type *)local_5e0);
        cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_5e0);
      }
    }
    std::make_unique<cmMakefile::DeferCommands>();
    this_01 = &subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
    operator=(&this->Defer,
              (unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
               *)this_01);
    std::unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
    ~unique_ptr((unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
                 *)this_01);
    defer = std::
            unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
            get(&this->Defer);
    RunListFile(this,(cmListFile *)(local_1f0 + 0x10),(string *)local_30,defer);
    std::unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
    reset(&this->Defer,(pointer)0x0);
    bVar1 = cmSystemTools::GetFatalErrorOccurred();
    if (bVar1) {
      BuildsystemFileScope::Quiet((BuildsystemFileScope *)((long)&filesDir.field_2 + 8));
    }
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
              ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi,
               &this->UnConfiguredDirectories);
    local_728._M_current =
         (cmMakefile **)
         std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin
                   ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
    while( true ) {
      local_730._M_current =
           (cmMakefile **)
           std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::end
                     ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
      bVar1 = __gnu_cxx::operator!=(&local_728,&local_730);
      if (!bVar1) break;
      ppcVar7 = __gnu_cxx::
                __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                ::operator*(&local_728);
      cmStateSnapshot::InitializeFromParent_ForSubdirsCommand(&(*ppcVar7)->StateSnapshot);
      ppcVar7 = __gnu_cxx::
                __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                ::operator*(&local_728);
      ConfigureSubDirectory(this,*ppcVar7);
      __gnu_cxx::
      __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>::
      operator++(&local_728);
    }
    AddCMakeDependFilesFromUser(this);
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~vector
              ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
    local_218._20_4_ = 0;
  }
  else {
    GetCMakeInstance(this);
    cmake::GetDebugAdapter((cmake *)local_1f0);
    bVar1 = std::operator!=((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_1f0,(nullptr_t)0x0);
    std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_1f0);
    if (bVar1) {
      GetCMakeInstance(this);
      cmake::GetDebugAdapter((cmake *)local_200);
      peVar4 = std::
               __shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_200);
      cmDebugger::cmDebuggerAdapter::OnEndFileParse(peVar4);
      std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
                ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)local_200);
    }
    local_218._20_4_ = 1;
  }
  cmListFile::~cmListFile((cmListFile *)(local_1f0 + 0x10));
  std::__cxx11::string::~string((string *)local_140);
  BuildsystemFileScope::~BuildsystemFileScope((BuildsystemFileScope *)((long)&filesDir.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmMakefile::Configure()
{
  std::string currentStart = cmStrCat(
    this->StateSnapshot.GetDirectory().GetCurrentSource(), "/CMakeLists.txt");

  // Add the bottom of all backtraces within this directory.
  // We will never pop this scope because it should be available
  // for messages during the generate step too.
  this->Backtrace =
    this->Backtrace.Push(cmListFileContext::FromListFilePath(currentStart));

  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = cmStrCat(
    this->StateSnapshot.GetDirectory().GetCurrentBinary(), "/CMakeFiles");
  cmSystemTools::MakeDirectory(filesDir);

  assert(cmSystemTools::FileExists(currentStart, true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart);

#ifdef CMake_ENABLE_DEBUGGER
  if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
    this->GetCMakeInstance()->GetDebugAdapter()->OnBeginFileParse(
      this, currentStart);
  }
#endif

  cmListFile listFile;
  if (!listFile.ParseFile(currentStart.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
#ifdef CMake_ENABLE_DEBUGGER
    if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
      this->GetCMakeInstance()->GetDebugAdapter()->OnEndFileParse();
    }
#endif

    return;
  }

#ifdef CMake_ENABLE_DEBUGGER
  if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
    this->GetCMakeInstance()->GetDebugAdapter()->OnEndFileParse();
    this->GetCMakeInstance()->GetDebugAdapter()->OnFileParsedSuccessfully(
      currentStart, listFile.Functions);
  }
#endif

  if (this->IsRootMakefile()) {
    bool hasVersion = false;
    // search for the right policy command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.LowerCaseName() == "cmake_minimum_required"_s) {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if (!hasVersion) {
      bool isProblem = true;
      if (listFile.Functions.size() < 30) {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for (cmListFileFunction const& func : listFile.Functions) {
          if (!cm::contains(allowedCommands, func.LowerCaseName())) {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem) {
        // Tell the top level cmMakefile to diagnose
        // this violation of CMP0000.
        this->SetCheckCMP0000(true);

        // Implicitly set the version for the user.
        cmPolicies::ApplyPolicyVersion(this, 2, 4, 0,
                                       cmPolicies::WarnCompat::Off);
      }
    }
    bool hasProject = false;
    // search for a project command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.LowerCaseName() == "project"_s) {
        hasProject = true;
        break;
      }
    }
    // if no project command is found, add one
    if (!hasProject) {
      this->GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING,
        "No project() command is present.  The top-level CMakeLists.txt "
        "file must contain a literal, direct call to the project() command.  "
        "Add a line of code such as\n"
        "  project(ProjectName)\n"
        "near the top of the file, but after cmake_minimum_required().\n"
        "CMake is pretending there is a \"project(Project)\" command on "
        "the first line.",
        this->Backtrace);
      cmListFileFunction project{ "project",
                                  0,
                                  0,
                                  { { "Project", cmListFileArgument::Unquoted,
                                      0 },
                                    { "__CMAKE_INJECTED_PROJECT_COMMAND__",
                                      cmListFileArgument::Unquoted, 0 } } };
      listFile.Functions.insert(listFile.Functions.begin(), project);
    }
  }

  this->Defer = cm::make_unique<DeferCommands>();
  this->RunListFile(listFile, currentStart, this->Defer.get());
  this->Defer.reset();
  if (cmSystemTools::GetFatalErrorOccurred()) {
    scope.Quiet();
  }

  // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  auto sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi) {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
  }

  this->AddCMakeDependFilesFromUser();
}